

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Int64Parameter::ByteSizeLong(Int64Parameter *this)

{
  AllowedValuesCase AVar1;
  int iVar2;
  int64 iVar3;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  Int64Parameter *this_local;
  
  sStack_18 = 0;
  iVar3 = defaultvalue(this);
  if (iVar3 != 0) {
    iVar3 = defaultvalue(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::Int64Size(iVar3);
    sStack_18 = sStack_18 + 1;
  }
  AVar1 = AllowedValues_case(this);
  if (AVar1 != ALLOWEDVALUES_NOT_SET) {
    if (AVar1 == kRange) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Int64Range>((this->AllowedValues_).range_)
      ;
      sStack_18 = sVar4 + 1 + sStack_18;
    }
    else if (AVar1 == kSet) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::Int64Set>((this->AllowedValues_).set_);
      sStack_18 = sVar4 + 1 + sStack_18;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t Int64Parameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Int64Parameter)
  size_t total_size = 0;

  // int64 defaultValue = 1;
  if (this->defaultvalue() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->defaultvalue());
  }

  switch (AllowedValues_case()) {
    // .CoreML.Specification.Int64Range range = 10;
    case kRange: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AllowedValues_.range_);
      break;
    }
    // .CoreML.Specification.Int64Set set = 11;
    case kSet: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AllowedValues_.set_);
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}